

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

void PDHG_Compute_Residuals(CUPDLPwork *work)

{
  int iVar1;
  long in_RDI;
  CUPDLPvec *aty;
  CUPDLPvec *ax;
  CUPDLPvec *y;
  CUPDLPvec *x;
  cupdlp_int iter;
  CUPDLPsettings *settings;
  CUPDLPscaling *scaling;
  CUPDLPiterates *iterates;
  CUPDLPresobj *resobj;
  CUPDLPdata *lp;
  CUPDLPproblem *problem;
  cupdlp_float *ax_00;
  cupdlp_float *dPrimalFeasibility;
  cupdlp_float *dDualFeasibility;
  cupdlp_float *y_00;
  cupdlp_float *primalResidual;
  CUPDLPwork *work_00;
  cupdlp_float *dualResidual;
  CUPDLPwork *work_01;
  cupdlp_float *dDualObj;
  cupdlp_float *dComplementarity;
  cupdlp_float *dSlackPos;
  cupdlp_float *dSlackNeg;
  
  dSlackNeg = *(cupdlp_float **)(in_RDI + 0x10);
  ax_00 = *(cupdlp_float **)(in_RDI + 0x18);
  dComplementarity = *(cupdlp_float **)(in_RDI + 0x28);
  dDualObj = *(cupdlp_float **)(in_RDI + 8);
  iVar1 = **(int **)(in_RDI + 0x30);
  work_01 = (CUPDLPwork *)ax_00[(long)(iVar1 % 2) + 8];
  dualResidual = (cupdlp_float *)ax_00[(long)(iVar1 % 2) + 10];
  work_00 = (CUPDLPwork *)ax_00[(long)(iVar1 % 2) + 0xc];
  primalResidual = (cupdlp_float *)ax_00[(long)(iVar1 % 2) + 0xe];
  dPrimalFeasibility = ax_00;
  dDualFeasibility = ax_00;
  y_00 = ax_00;
  dSlackPos = ax_00;
  PDHG_Compute_Primal_Feasibility(work_00,primalResidual,ax_00,ax_00,ax_00,ax_00);
  PDHG_Compute_Dual_Feasibility
            (work_01,dualResidual,(cupdlp_float *)work_00,primalResidual,y_00,dDualFeasibility,
             dDualObj,dComplementarity,dSlackPos,dSlackNeg);
  PDHG_Compute_Primal_Feasibility
            (work_00,primalResidual,y_00,dDualFeasibility,dPrimalFeasibility,ax_00);
  PDHG_Compute_Dual_Feasibility
            (work_01,dualResidual,(cupdlp_float *)work_00,primalResidual,y_00,dDualFeasibility,
             dDualObj,dComplementarity,dSlackPos,dSlackNeg);
  dSlackNeg[3] = dSlackNeg[1] - dSlackNeg[2];
  dSlackNeg[7] = ABS(dSlackNeg[1] - dSlackNeg[2]) / (ABS(dSlackNeg[1]) + 1.0 + ABS(dSlackNeg[2]));
  dSlackNeg[0x23] = dSlackNeg[0x21] - dSlackNeg[0x22];
  dSlackNeg[0x27] =
       ABS(dSlackNeg[0x21] - dSlackNeg[0x22]) / (ABS(dSlackNeg[0x21]) + 1.0 + ABS(dSlackNeg[0x22]));
  return;
}

Assistant:

void PDHG_Compute_Residuals(CUPDLPwork *work) {
#if problem_USE_TIMERS
  ++problem->nComputeResidualsCalls;
  double dStartTime = getTimeStamp();
#endif
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPresobj *resobj = work->resobj;
  CUPDLPiterates *iterates = work->iterates;
  CUPDLPscaling *scaling = work->scaling;
  CUPDLPsettings *settings = work->settings;

  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];


  PDHG_Compute_Primal_Feasibility(work, resobj->primalResidual,
                                  ax->data, x->data,
                                  &resobj->dPrimalFeas, &resobj->dPrimalObj);
  PDHG_Compute_Dual_Feasibility(
      work, resobj->dualResidual, aty->data, x->data,
      y->data, &resobj->dDualFeas, &resobj->dDualObj,
      &resobj->dComplementarity, resobj->dSlackPos, resobj->dSlackNeg);

  PDHG_Compute_Primal_Feasibility(
      work, resobj->primalResidualAverage, iterates->axAverage->data,
      iterates->xAverage->data, &resobj->dPrimalFeasAverage,
      &resobj->dPrimalObjAverage);
  PDHG_Compute_Dual_Feasibility(
      work, resobj->dualResidualAverage, iterates->atyAverage->data,
      iterates->xAverage->data, iterates->yAverage->data,
      &resobj->dDualFeasAverage, &resobj->dDualObjAverage,
      &resobj->dComplementarityAverage, resobj->dSlackPosAverage,
      resobj->dSlackNegAverage);

  // resobj->dPrimalObj /= (scaling->dObjScale * scaling->dObjScale);
  // resobj->dDualObj /= (scaling->dObjScale * scaling->dObjScale);
  resobj->dDualityGap = resobj->dPrimalObj - resobj->dDualObj;
  resobj->dRelObjGap =
      fabs(resobj->dPrimalObj - resobj->dDualObj) /
      (1.0 + fabs(resobj->dPrimalObj) + fabs(resobj->dDualObj));

  // resobj->dPrimalObjAverage /= scaling->dObjScale * scaling->dObjScale;
  // resobj->dDualObjAverage /= scaling->dObjScale * scaling->dObjScale;
  resobj->dDualityGapAverage =
      resobj->dPrimalObjAverage - resobj->dDualObjAverage;
  resobj->dRelObjGapAverage =
      fabs(resobj->dPrimalObjAverage - resobj->dDualObjAverage) /
      (1.0 + fabs(resobj->dPrimalObjAverage) + fabs(resobj->dDualObjAverage));

#if problem_USE_TIMERS
  problem->dComputeResidualsTime += getTimeStamp() - dStartTime;
#endif
}